

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.h
# Opt level: O1

SparseVectorWriter<int,_double> __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
          (SingleSparseVecWrtFactory<int,_double> *this,size_t nnz)

{
  char *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  SparseVectorWriter<int,_double> SVar2;
  
  if (*(char **)(nnz + 8) == (char *)0x0) {
    sVar1 = 0;
    if (*(long *)(nnz + 0x20) != 0) {
      (**(code **)(nnz + 0x28))(nnz + 0x10);
      sVar1 = extraout_RDX_00;
    }
  }
  else {
    TextFormatter::apr(*(TextFormatter **)nnz,(File *)&(*(TextFormatter **)nnz)[0x13].nl_comments,
                       *(char **)(nnz + 8),(ulong)in_RDX & 0xffffffff);
    sVar1 = extraout_RDX;
  }
  this->nlw_ = *(NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> **)nnz;
  this->fmt_ = in_RDX;
  SVar2.n_entries_ = sVar1;
  SVar2.p_nlw_ = (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)this;
  return SVar2;
}

Assistant:

SparseVectorWriter<Index, Value> MakeVectorWriter(size_t nnz) {
      assert(0 == nInst_++);
      if (fmt_)
        nlw_.apr(nlw_.nm, fmt_, (int)nnz);
      else if (hdr_prn_)
        hdr_prn_(nnz);
      else {
        assert(0);
      }
      return {nlw_, nnz};
    }